

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MixedVertexBindingOffsetCase::test
          (MixedVertexBindingOffsetCase *this,ResultCollector *result)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  CallLogWrapper gl;
  Buffer buffer;
  CallLogWrapper local_48;
  ObjectWrapper local_30;
  
  iVar1 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_48,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar1 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_30,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_48.m_enableLog = true;
  glu::CallLogWrapper::glBindBuffer(&local_48,0x8892,local_30.m_object);
  glu::CallLogWrapper::glVertexAttribPointer(&local_48,1,4,0x1406,'\0',0,(void *)0xc);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&local_48,0x82d7,1,0xc,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&local_30);
  glu::CallLogWrapper::~CallLogWrapper(&local_48);
  return;
}

Assistant:

void MixedVertexBindingOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::Buffer			buffer				(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glBindBuffer(GL_ARRAY_BUFFER, *buffer);
	gl.glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, (const deUint8*)DE_NULL + 12);

	verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_OFFSET, 1, 12, m_verifier);
}